

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void js_array_finalizer(JSRuntime *rt,JSValue val)

{
  JSValueUnion JVar1;
  int iVar2;
  int64_t iVar3;
  JSValueUnion JVar4;
  ulong uVar5;
  long lVar6;
  JSValue v;
  
  JVar4 = val.u;
  if (*(int *)((long)JVar4.ptr + 0x40) != 0) {
    lVar6 = 8;
    uVar5 = 0;
    do {
      JVar1 = (JSValueUnion)((JSValueUnion *)(*(long *)((long)JVar4.ptr + 0x38) + -8 + lVar6))->ptr;
      iVar3 = *(int64_t *)(*(long *)((long)JVar4.ptr + 0x38) + lVar6);
      if ((0xfffffff4 < (uint)iVar3) &&
         (iVar2 = *JVar1.ptr, *(int *)JVar1.ptr = iVar2 + -1, iVar2 < 2)) {
        v.tag = iVar3;
        v.u.ptr = JVar1.ptr;
        __JS_FreeValueRT(rt,v);
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar5 < *(uint *)((long)JVar4.ptr + 0x40));
  }
  (*(rt->mf).js_free)(&rt->malloc_state,*(void **)((long)JVar4.ptr + 0x38));
  return;
}

Assistant:

static void js_array_finalizer(JSRuntime *rt, JSValue val)
{
    JSObject *p = JS_VALUE_GET_OBJ(val);
    int i;

    for(i = 0; i < p->u.array.count; i++) {
        JS_FreeValueRT(rt, p->u.array.u.values[i]);
    }
    js_free_rt(rt, p->u.array.u.values);
}